

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disco_test.cpp
# Opt level: O1

void __thiscall unit_test::main(unit_test *this,string *param_1)

{
  undefined8 in_RAX;
  ulong uVar1;
  ostream *poVar2;
  long lVar3;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Running sync test\n",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  calls = calls + 1;
  cppcms::application::response();
  uVar1 = cppcms::http::response::out();
  lVar3 = 0;
  do {
    poVar2 = std::ostream::_M_insert<unsigned_long>(uVar1);
    uStack_28 = CONCAT17(10,(undefined7)uStack_28);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(char *)((long)&uStack_28 + 7),1);
    if (((byte)poVar2[*(long *)(*(long *)poVar2 + -0x18) + 0x20] & 5) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Sync Disconned as expected",0x1a);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
      std::ostream::put(-0x40);
      std::ostream::flush();
      bad_count = bad_count + 1;
      return;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 10000000);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Sync Not disconnected!",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  return;
}

Assistant:

virtual void main(std::string /*unused*/)
	{
		std::cout << "Running sync test\n" << std::endl;
		calls ++;
		bool bad_found = false;
		std::ostream &out = response().out();
		for(unsigned i=0;i<10000000;i++) {
			if(!(out << i << '\n')) {
				bad_found = true;
				break;
			}
		}
		if(bad_found) {
			std::cout << "Sync Disconned as expected" << std::endl;
			bad_count++;
		}
		else {
			std::cout << "Sync Not disconnected!" << std::endl;
		}
	}